

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::initEmpty(DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
            *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  *(undefined8 *)(this + 8) = 0;
  uVar1 = *(uint *)(this + 0x10);
  if ((uVar1 & uVar1 - 1) == 0) {
    if ((ulong)uVar1 != 0) {
      lVar2 = *(long *)this;
      lVar3 = 0;
      do {
        *(undefined8 *)(lVar2 + lVar3) = 0;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar1 << 4 != lVar3);
    }
    return;
  }
  __assert_fail("(getNumBuckets() & (getNumBuckets()-1)) == 0 && \"# initial buckets must be a power of two!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x158,
                "void llvm::DenseMapBase<llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, llbuild::core::KeyID, DBKeyID, llvm::DenseMapInfo<llbuild::core::KeyID>, llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>>::initEmpty() [DerivedT = llvm::DenseMap<llbuild::core::KeyID, DBKeyID>, KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>]"
               );
}

Assistant:

void initEmpty() {
    setNumEntries(0);
    setNumTombstones(0);

    assert((getNumBuckets() & (getNumBuckets()-1)) == 0 &&
           "# initial buckets must be a power of two!");
    const KeyT EmptyKey = getEmptyKey();
    for (BucketT *B = getBuckets(), *E = getBucketsEnd(); B != E; ++B)
      ::new (&B->getFirst()) KeyT(EmptyKey);
  }